

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O0

_Bool do_fmla(DisasContext_conflict1 *s,arg_rprrr_esz *a,gen_helper_sve_fmla *fn)

{
  TCGContext_conflict1 *tcg_ctx_00;
  TCGv_ptr a_00;
  _Bool _Var1;
  uint32_t uVar2;
  uint32_t uVar3;
  int iVar4;
  TCGv_ptr r;
  TCGv_i32 arg;
  TCGv_ptr pg;
  TCGv_i32 t_desc;
  uint desc;
  uint vsz;
  TCGContext_conflict1 *tcg_ctx;
  gen_helper_sve_fmla *fn_local;
  arg_rprrr_esz *a_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  if (fn == (gen_helper_sve_fmla *)0x0) {
    s_local._7_1_ = false;
  }
  else {
    _Var1 = sve_access_check_aarch64(s);
    if (_Var1) {
      uVar2 = vec_full_reg_size(s);
      r = tcg_temp_new_ptr(tcg_ctx_00);
      uVar3 = deposit32(a->rd,5,5,a->rn);
      uVar3 = deposit32(uVar3,10,5,a->rm);
      uVar3 = deposit32(uVar3,0xf,5,a->ra);
      uVar2 = simd_desc_aarch64(uVar2,uVar2,uVar3);
      arg = tcg_const_i32_aarch64(tcg_ctx_00,uVar2);
      a_00 = tcg_ctx_00->cpu_env;
      iVar4 = pred_full_reg_offset(s,a->pg);
      tcg_gen_addi_ptr(tcg_ctx_00,r,a_00,(long)iVar4);
      (*fn)(tcg_ctx_00,tcg_ctx_00->cpu_env,r,arg);
      tcg_temp_free_i32(tcg_ctx_00,arg);
      tcg_temp_free_ptr(tcg_ctx_00,r);
      s_local._7_1_ = true;
    }
    else {
      s_local._7_1_ = true;
    }
  }
  return s_local._7_1_;
}

Assistant:

static bool do_fmla(DisasContext *s, arg_rprrr_esz *a, gen_helper_sve_fmla *fn)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    if (fn == NULL) {
        return false;
    }
    if (!sve_access_check(s)) {
        return true;
    }

    unsigned vsz = vec_full_reg_size(s);
    unsigned desc;
    TCGv_i32 t_desc;
    TCGv_ptr pg = tcg_temp_new_ptr(tcg_ctx);

    /* We would need 7 operands to pass these arguments "properly".
     * So we encode all the register numbers into the descriptor.
     */
    desc = deposit32(a->rd, 5, 5, a->rn);
    desc = deposit32(desc, 10, 5, a->rm);
    desc = deposit32(desc, 15, 5, a->ra);
    desc = simd_desc(vsz, vsz, desc);

    t_desc = tcg_const_i32(tcg_ctx, desc);
    tcg_gen_addi_ptr(tcg_ctx, pg, tcg_ctx->cpu_env, pred_full_reg_offset(s, a->pg));
    fn(tcg_ctx, tcg_ctx->cpu_env, pg, t_desc);
    tcg_temp_free_i32(tcg_ctx, t_desc);
    tcg_temp_free_ptr(tcg_ctx, pg);
    return true;
}